

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

void __thiscall METADemuxer::updateReport(METADemuxer *this,bool checkTime)

{
  long lVar1;
  int64_t iVar2;
  ostream *poVar3;
  undefined7 in_register_00000031;
  METADemuxer *this_00;
  double dVar4;
  double local_48;
  string local_40;
  
  this_00 = this;
  lVar1 = std::chrono::_V2::steady_clock::now();
  if (((int)CONCAT71(in_register_00000031,checkTime) == 0) ||
     (250000000 < lVar1 - (this->m_lastReportTime).__d.__r)) {
    local_48 = 100.0;
    if (0 < this->m_totalSize) {
      this_00 = this;
      iVar2 = getDemuxedSize(this);
      dVar4 = ((double)iVar2 / (double)this->m_totalSize) * 100.0;
      local_48 = 100.0;
      if (dVar4 <= 100.0) {
        local_48 = dVar4;
      }
    }
    lineBack(this_00);
    doubleToStr_abi_cxx11_(&local_40,&local_48,1);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_40);
    poVar3 = std::operator<<(poVar3,"% complete");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_40);
    (this->m_lastReportTime).__d.__r = lVar1;
  }
  return;
}

Assistant:

void METADemuxer::updateReport(const bool checkTime)
{
    const auto currentTime = std::chrono::steady_clock::now();
    if (!checkTime || currentTime - m_lastReportTime > std::chrono::microseconds(250000))
    {
        double progress = 100.0;
        if (m_totalSize > 0)
        {
            const int64_t currentProcessedSize = getDemuxedSize();
            progress = static_cast<double>(currentProcessedSize) / static_cast<double>(m_totalSize) * 100.0;
            if (progress > 100.0)
                progress = 100.0;
        }
        lineBack();
        cout << doubleToStr(progress, 1) << "% complete" << std::endl;
        m_lastReportTime = currentTime;
    }
}